

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::printConnectedComponents(Graph<Node> *this,ofstream *fout)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  vector<int> *pvVar4;
  int *piVar5;
  int local_20;
  int local_1c;
  int j;
  int i;
  ofstream *fout_local;
  Graph<Node> *this_local;
  
  _j = fout;
  fout_local = (ofstream *)this;
  std::operator<<((ostream *)fout,"Connected components in current graph:\n\n");
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = vector<vector<int>_>::size(&this->compList);
    if (iVar2 <= iVar1) break;
    poVar3 = (ostream *)std::ostream::operator<<(_j,local_1c);
    std::operator<<(poVar3,": ");
    local_20 = 0;
    while( true ) {
      iVar1 = local_20;
      pvVar4 = vector<vector<int>_>::operator[](&this->compList,&local_1c);
      iVar2 = vector<int>::size(pvVar4);
      poVar3 = (ostream *)_j;
      if (iVar2 <= iVar1) break;
      pvVar4 = vector<vector<int>_>::operator[](&this->compList,&local_1c);
      piVar5 = vector<int>::operator[](pvVar4,&local_20);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar5);
      std::operator<<(poVar3,' ');
      local_20 = local_20 + 1;
    }
    std::operator<<((ostream *)_j,'\n');
    local_1c = local_1c + 1;
  }
  std::operator<<((ostream *)_j,"------------------------\n\n");
  return;
}

Assistant:

void printConnectedComponents(std::ofstream &fout) {
        fout << "Connected components in current graph:\n\n";
        for (int i = 0; i < compList.size(); ++i) {
            fout << i << ": ";
            for (int j = 0; j < compList[i].size(); ++j) {
                fout << compList[i][j] << ' ';
            }
            fout << '\n';
        }

        fout << "------------------------\n\n";
    }